

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O3

long duckdb::DateSubTernaryOperator::
     Operation<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long>
               (string_t part,dtime_t startdate,dtime_t enddate,ValidityMask *mask,idx_t idx)

{
  DatePartSpecifier DVar1;
  NotImplementedException *this;
  long lVar2;
  long lVar3;
  dtime_t enddate_00;
  dtime_t startdate_00;
  string local_78;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  local_30 = part.value._8_8_;
  local_38 = part.value._0_8_;
  startdate_00.micros = (int64_t)&local_78;
  enddate_00.micros = local_30;
  if (part.value._0_4_ < 0xd) {
    enddate_00.micros = (long)&local_38 + 4;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,enddate_00.micros,(ulong)part.value._0_4_ + enddate_00.micros);
  DVar1 = GetDatePartSpecifier(&local_78);
  switch(DVar1) {
  case BEGIN_BIGINT:
  case ISOYEAR:
    DateSub::YearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case MONTH:
    DateSub::MonthOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    DateSub::DayOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case DECADE:
    DateSub::DecadeOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case CENTURY:
    DateSub::CenturyOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MILLENNIUM:
    DateSub::MilleniumOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MICROSECONDS:
    lVar3 = enddate.micros - startdate.micros;
    goto LAB_01a062e3;
  case MILLISECONDS:
    lVar2 = enddate.micros - startdate.micros;
    lVar3 = lVar2 / 1000 + (lVar2 >> 0x3f);
    break;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar2 = enddate.micros - startdate.micros;
    lVar3 = lVar2 / 1000000 + (lVar2 >> 0x3f);
    break;
  case MINUTE:
    lVar2 = enddate.micros - startdate.micros;
    lVar3 = lVar2 / 60000000 + (lVar2 >> 0x3f);
    goto LAB_01a062dd;
  case HOUR:
    lVar2 = enddate.micros - startdate.micros;
    lVar3 = lVar2 / 3600000000 + (lVar2 >> 0x3f);
LAB_01a062dd:
    lVar3 = lVar3 - (lVar2 >> 0x3f);
    goto LAB_01a062e3;
  case WEEK:
  case YEARWEEK:
    DateSub::WeekOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case QUARTER:
    DateSub::QuarterOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Specifier type not implemented for DATESUB","");
    NotImplementedException::NotImplementedException(this,&local_58);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar3 = lVar3 - (lVar2 >> 0x3f);
LAB_01a062e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return lVar3;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return SubtractDateParts<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}